

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_global.h
# Opt level: O3

vector<Eigen::Array<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Array<double,_2,_1,_0,_2,_1>_>_> *
__thiscall
lf::mesh::utils::
MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_unary_tests.cc:64:5)>
::operator()(vector<Eigen::Array<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Array<double,_2,_1,_0,_2,_1>_>_>
             *__return_storage_ptr__,
            MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_unary_tests_cc:64:5)>
            *this,Entity *e,MatrixXd *local)

{
  pointer *ppAVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  iterator __position;
  undefined8 uVar4;
  int iVar5;
  dim_t dVar6;
  undefined4 extraout_var;
  vector<Eigen::Array<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Array<double,_2,_1,_0,_2,_1>_>_>
  *extraout_RAX;
  PointerType ptr;
  long i;
  MatrixXd global_points;
  stringstream ss;
  assign_op<double,_double> local_219;
  string local_218;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [392];
  
  iVar5 = (*this->_vptr_MeshFunctionGlobal[4])(this);
  dVar6 = base::internal::DimensionImpl((RefElType)iVar5);
  if (e[1]._vptr_Entity == (_func_int **)(ulong)dVar6) {
    (__return_storage_ptr__->
    super__Vector_base<Eigen::Array<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Array<double,_2,_1,_0,_2,_1>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<Eigen::Array<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Array<double,_2,_1,_0,_2,_1>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<Eigen::Array<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Array<double,_2,_1,_0,_2,_1>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<Eigen::Array<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Array<double,_2,_1,_0,_2,_1>_>_>
    ::reserve(__return_storage_ptr__,(size_type)e[2]._vptr_Entity);
    iVar5 = (*this->_vptr_MeshFunctionGlobal[3])(this);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar5) + 0x18))
              (&local_218,(long *)CONCAT44(extraout_var,iVar5),e);
    if (0 < (long)e[2]._vptr_Entity) {
      i = 0;
      do {
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_1b8,
                   (Matrix<double,__1,__1,_0,__1,__1> *)&local_218,i);
        Eigen::PlainObjectBase<Eigen::Array<double,_2,_1,_0,_2,_1>_>::resize
                  ((PlainObjectBase<Eigen::Array<double,_2,_1,_0,_2,_1>_> *)&local_1f8,
                   local_1b8._8_8_,1);
        uVar4 = local_1b8._0_8_;
        Eigen::internal::
        resize_if_allowed<Eigen::Array<double,2,1,0,2,1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,double,double>
                  ((Array<double,_2,_1,_0,_2,_1> *)&local_1f8,
                   (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_1b8,
                   &local_219);
        local_1f8._M_dataplus._M_p = *(pointer *)uVar4;
        local_1f8._M_string_length = *(size_type *)(uVar4 + 8);
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<Eigen::Array<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Array<double,_2,_1,_0,_2,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        local_1d8._M_dataplus._M_p = local_1f8._M_dataplus._M_p;
        local_1d8._M_string_length = local_1f8._M_string_length;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<Eigen::Array<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Array<double,_2,_1,_0,_2,_1>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Eigen::Array<double,2,1,0,2,1>,std::allocator<Eigen::Array<double,2,1,0,2,1>>>
          ::_M_realloc_insert<Eigen::Array<double,2,1,0,2,1>>
                    ((vector<Eigen::Array<double,2,1,0,2,1>,std::allocator<Eigen::Array<double,2,1,0,2,1>>>
                      *)__return_storage_ptr__,__position,(Array<double,_2,_1,_0,_2,_1> *)&local_1d8
                    );
        }
        else {
          ((__position._M_current)->super_PlainObjectBase<Eigen::Array<double,_2,_1,_0,_2,_1>_>).
          m_storage.m_data.array[0] = (double)local_1f8._M_dataplus._M_p;
          ((__position._M_current)->super_PlainObjectBase<Eigen::Array<double,_2,_1,_0,_2,_1>_>).
          m_storage.m_data.array[1] = (double)local_1f8._M_string_length;
          ppAVar1 = &(__return_storage_ptr__->
                     super__Vector_base<Eigen::Array<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Array<double,_2,_1,_0,_2,_1>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppAVar1 = *ppAVar1 + 1;
        }
        i = i + 1;
      } while (i < (long)e[2]._vptr_Entity);
    }
    free(local_218._M_dataplus._M_p);
    return extraout_RAX;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b8 + 0x10),"mismatch between entity dimension and local.rows()",0x32
            );
  paVar2 = &local_218.field_2;
  local_218._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_218,"e.RefEl().Dimension() == local.rows()","");
  paVar3 = &local_1d8.field_2;
  local_1d8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_global.h"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed(&local_218,&local_1d8,0x50,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar3) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  local_218._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"false","");
  local_1d8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_global.h"
             ,"");
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
  base::AssertionFailed(&local_218,&local_1d8,0x50,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_218);
  abort();
}

Assistant:

std::vector<F_return_type> operator()(const mesh::Entity& e,
                                        const Eigen::MatrixXd& local) const {
    LF_ASSERT_MSG(e.RefEl().Dimension() == local.rows(),
                  "mismatch between entity dimension and local.rows()");
    std::vector<F_return_type> result;
    result.reserve(local.cols());
    auto global_points = e.Geometry()->Global(local);
    for (long i = 0; i < local.cols(); ++i) {
      result.push_back(f_(global_points.col(i)));
    }
    return result;
  }